

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deleteUnusedVariables.cpp
# Opt level: O1

void deleteUnusedVariables(Module *module,Program *program)

{
  pointer *pppEVar1;
  Module *pMVar2;
  Function *pFVar3;
  pointer ppEVar4;
  use_iterator_impl<const_llvm::Use> B;
  Func *this;
  Block *pBVar5;
  Expr *pEVar6;
  size_t sVar7;
  Function *f;
  Value *val;
  BasicBlock *pBVar8;
  pointer ppEVar9;
  Function *block;
  BasicBlock *val_00;
  
  pMVar2 = *(Module **)(module + 0x20);
  do {
    if (pMVar2 == module + 0x18) {
      Program::addPass(program,DeleteUnusedVariables);
      return;
    }
    f = (Function *)(pMVar2 + -0x38);
    if (pMVar2 == (Module *)0x0) {
      f = (Function *)0x0;
    }
    this = Program::getFunction(program,f);
    for (pFVar3 = *(Function **)(f + 0x50); pFVar3 != f + 0x48; pFVar3 = *(Function **)(pFVar3 + 8))
    {
      block = pFVar3 + -0x18;
      if (pFVar3 == (Function *)0x0) {
        block = (Function *)0x0;
      }
      pBVar5 = Func::getBlock(this,(BasicBlock *)block);
      for (pBVar8 = *(BasicBlock **)((BasicBlock *)block + 0x30);
          pBVar8 != (BasicBlock *)block + 0x28; pBVar8 = *(BasicBlock **)(pBVar8 + 8)) {
        val_00 = pBVar8 + -0x18;
        if (pBVar8 == (BasicBlock *)0x0) {
          val_00 = (BasicBlock *)0x0;
        }
        if (((((Value *)val_00)[0x10] == (Value)0x3a) && (*(long *)((Value *)val_00 + 8) != 0)) &&
           (*(long *)(*(long *)((Value *)val_00 + 8) + 8) == 0)) {
          pEVar6 = Func::getExpr(this,(Value *)val_00);
          val = *(Value **)(*(long *)((Value *)val_00 + 8) + 0x18);
          if (val == (Value *)0x0) {
            val = (Value *)0x0;
          }
          else if (val[0x10] != (Value)0x3c) {
            val = (Value *)0x0;
          }
          if (((val != (Value *)0x0) && (*(Value **)(val + -0x40) != (Value *)val_00)) &&
             (*(Value **)(val + -0x20) == (Value *)val_00)) {
            ppEVar9 = (pBVar5->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppEVar4 = (pBVar5->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppEVar9 != ppEVar4) {
              sVar7 = (long)ppEVar4 - (long)ppEVar9;
              do {
                sVar7 = sVar7 - 8;
                if (*ppEVar9 == pEVar6) {
                  if (ppEVar9 + 1 != ppEVar4) {
                    memmove(ppEVar9,ppEVar9 + 1,sVar7);
                  }
                  pppEVar1 = &(pBVar5->expressions).
                              super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppEVar1 = *pppEVar1 + -1;
                  break;
                }
                ppEVar9 = ppEVar9 + 1;
              } while (ppEVar9 != ppEVar4);
            }
            pEVar6 = Func::getExpr(this,val);
            ppEVar9 = (pBVar5->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppEVar4 = (pBVar5->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppEVar9 != ppEVar4) {
              sVar7 = (long)ppEVar4 - (long)ppEVar9;
              do {
                sVar7 = sVar7 - 8;
                if (*ppEVar9 == pEVar6) {
                  if (ppEVar9 + 1 != ppEVar4) {
                    memmove(ppEVar9,ppEVar9 + 1,sVar7);
                  }
                  pppEVar1 = &(pBVar5->expressions).
                              super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppEVar1 = *pppEVar1 + -1;
                  break;
                }
                ppEVar9 = ppEVar9 + 1;
              } while (ppEVar9 != ppEVar4);
            }
          }
        }
      }
    }
    pMVar2 = *(Module **)(pMVar2 + 8);
  } while( true );
}

Assistant:

void deleteUnusedVariables(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateExpressions));
    for (const llvm::Function& func : module->functions()) {
        auto* function = program.getFunction(&func);
        for (const auto& block : func) {
            auto* myBlock = function->getBlock(&block);

            for (const auto& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Alloca) {
                    if (ins.hasOneUse()) {
                        auto* alloca = function->getExpr(&ins);
                        auto* user = llvm::dyn_cast_or_null<llvm::StoreInst>(*ins.users().begin());
                        if (!user) {
                            continue;
                        }

                        // make sure the allocation is only used as a target of store
                        if (user->getValueOperand() != &ins && user->getPointerOperand() == &ins) {
                            deleteExprFromBlock(myBlock, alloca);
                            deleteExprFromBlock(myBlock, function->getExpr(user));
                        }
                    }
                }
            }
        }
    }

    program.addPass(PassType::DeleteUnusedVariables);
}